

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus assessLp(HighsLp *lp,HighsOptions *options)

{
  HighsLogOptions *log_options;
  int iVar1;
  bool bVar2;
  HighsStatus HVar3;
  HighsInt HVar4;
  HighsVarType *integrality;
  HighsStatus HVar5;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar6;
  string local_2e0;
  void **local_2c0;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_2b8;
  HighsSparseMatrix *local_2b0;
  undefined1 local_2a8 [32];
  undefined1 uStack_288;
  undefined7 uStack_287;
  undefined1 uStack_280;
  undefined8 uStack_27f;
  pointer local_270;
  pointer piStack_268;
  pointer local_260;
  string local_258;
  string local_238;
  HighsLogOptions local_218;
  HighsLogOptions local_1b8;
  HighsLogOptions local_158;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"assessLp","");
  log_options = &(options->super_HighsOptionsStruct).log_options;
  bVar2 = lpDimensionsOk(&local_238,lp,log_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_98.log_stream = log_options->log_stream;
  local_98.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
  local_98.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
  local_98.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
  local_98.user_log_callback = (options->super_HighsOptionsStruct).log_options.user_log_callback;
  local_98.user_log_callback_data =
       (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
  pfVar6 = &local_98.user_callback;
  local_2b8 = &(options->super_HighsOptionsStruct).log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar6,local_2b8);
  local_98.user_callback_active =
       (options->super_HighsOptionsStruct).log_options.user_callback_active;
  local_98.user_callback_data = (options->super_HighsOptionsStruct).log_options.user_callback_data;
  local_2a8._0_8_ = local_2a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"assessLpDimensions","");
  HVar5 = (uint)bVar2 + kError;
  HVar3 = interpretCallStatus(&local_98,HVar5,kOk,(string *)local_2a8);
  if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
    operator_delete((void *)local_2a8._0_8_);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar6,(_Any_data *)pfVar6,__destroy_functor);
    HVar5 = (HighsStatus)pfVar6;
  }
  if (HVar3 == kError) {
LAB_0023da0a:
    HVar5 = kError;
  }
  else {
    local_2c0 = &(options->super_HighsOptionsStruct).log_options.user_callback_data;
    iVar1 = lp->num_col_;
    if (iVar1 != 0) {
      local_2a8[0x10] = '\0';
      local_2a8._20_4_ = 0xffffffff;
      local_270 = (pointer)0x0;
      piStack_268 = (pointer)0x0;
      local_260 = (pointer)0x0;
      local_2a8._24_8_ = (void *)0x0;
      uStack_288 = 0;
      uStack_287 = 0;
      uStack_280 = 0;
      uStack_27f = 0;
      local_2a8[4] = true;
      local_2a8._0_4_ = iVar1;
      local_2a8._8_4_ = 0;
      local_2a8._12_4_ = iVar1 + -1;
      assessCosts(options,HVar5,(HighsIndexCollection *)local_2a8,&lp->col_cost_,
                  &lp->has_infinite_cost_,(options->super_HighsOptionsStruct).infinite_cost);
      local_158.log_stream = log_options->log_stream;
      local_158.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
      local_158.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
      local_158.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
      local_158.user_log_callback =
           (options->super_HighsOptionsStruct).log_options.user_log_callback;
      local_158.user_log_callback_data =
           (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
      pfVar6 = &local_158.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar6,local_2b8);
      local_158.user_callback_active = *(bool *)(local_2c0 + 1);
      local_158.user_callback_data = *local_2c0;
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"assessCosts","");
      HVar3 = interpretCallStatus(&local_158,kOk,HVar3,&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (local_158.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar6,(_Any_data *)pfVar6,__destroy_functor);
      }
      if (HVar3 == kError) {
        HVar3 = kError;
        bVar2 = false;
      }
      else {
        local_2b0 = (HighsSparseMatrix *)(options->super_HighsOptionsStruct).infinite_bound;
        bVar2 = HighsLp::isMip(lp);
        integrality = (HighsVarType *)0x0;
        if (bVar2) {
          integrality = (lp->integrality_).
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start;
        }
        HVar5 = assessBounds(options,"Col",0,(HighsIndexCollection *)local_2a8,&lp->col_lower_,
                             &lp->col_upper_,(double)local_2b0,integrality);
        local_1b8.log_stream = log_options->log_stream;
        local_1b8.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
        local_1b8.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
        local_1b8.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
        local_1b8.user_log_callback =
             (options->super_HighsOptionsStruct).log_options.user_log_callback;
        local_1b8.user_log_callback_data =
             (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
        pfVar6 = &local_1b8.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar6,local_2b8);
        local_1b8.user_callback_active = *(bool *)(local_2c0 + 1);
        local_1b8.user_callback_data = *local_2c0;
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"assessBounds","");
        HVar3 = interpretCallStatus(&local_1b8,HVar5,HVar3,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if (local_1b8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_1b8.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar6,(_Any_data *)pfVar6,__destroy_functor);
        }
        bVar2 = HVar3 != kError;
      }
      if (local_270 != (pointer)0x0) {
        operator_delete(local_270);
      }
      if ((void *)local_2a8._24_8_ != (void *)0x0) {
        operator_delete((void *)local_2a8._24_8_);
      }
      if (!bVar2) {
        return kError;
      }
    }
    iVar1 = lp->num_row_;
    if (iVar1 != 0) {
      local_2a8[0x10] = '\0';
      local_2a8._20_4_ = 0xffffffff;
      local_270 = (pointer)0x0;
      piStack_268 = (pointer)0x0;
      local_260 = (pointer)0x0;
      local_2a8._24_8_ = (void *)0x0;
      uStack_288 = 0;
      uStack_287 = 0;
      uStack_280 = 0;
      uStack_27f = 0;
      local_2a8[4] = true;
      local_2a8._0_4_ = iVar1;
      local_2a8._8_4_ = 0;
      local_2a8._12_4_ = iVar1 + -1;
      HVar5 = assessBounds(options,"Row",0,(HighsIndexCollection *)local_2a8,&lp->row_lower_,
                           &lp->row_upper_,(options->super_HighsOptionsStruct).infinite_bound,
                           (HighsVarType *)0x0);
      local_218.log_stream = log_options->log_stream;
      local_218.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
      local_218.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
      local_218.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
      local_218.user_log_callback =
           (options->super_HighsOptionsStruct).log_options.user_log_callback;
      local_218.user_log_callback_data =
           (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
      pfVar6 = &local_218.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar6,local_2b8);
      local_218.user_callback_active = *(bool *)(local_2c0 + 1);
      local_218.user_callback_data = *local_2c0;
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"assessBounds","");
      HVar3 = interpretCallStatus(&local_218,HVar5,HVar3,&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (local_218.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_218.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar6,(_Any_data *)pfVar6,__destroy_functor);
      }
      if (local_270 != (pointer)0x0) {
        operator_delete(local_270);
      }
      if ((void *)local_2a8._24_8_ != (void *)0x0) {
        operator_delete((void *)local_2a8._24_8_);
      }
      if (HVar3 == kError) goto LAB_0023da0a;
    }
    HVar5 = kOk;
    if (lp->num_col_ != 0) {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"LP","");
      local_2b0 = &lp->a_matrix_;
      HVar5 = HighsSparseMatrix::assess
                        (&lp->a_matrix_,log_options,&local_258,
                         (options->super_HighsOptionsStruct).small_matrix_value,
                         (options->super_HighsOptionsStruct).large_matrix_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      local_f8.log_stream = log_options->log_stream;
      local_f8.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
      local_f8.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
      local_f8.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
      local_f8.user_log_callback = (options->super_HighsOptionsStruct).log_options.user_log_callback
      ;
      local_f8.user_log_callback_data =
           (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
      pfVar6 = &local_f8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar6,local_2b8);
      local_f8.user_callback_active = *(bool *)(local_2c0 + 1);
      local_f8.user_callback_data = *local_2c0;
      local_2a8._0_8_ = local_2a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"assessMatrix","");
      HVar3 = interpretCallStatus(&local_f8,HVar5,HVar3,(string *)local_2a8);
      if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
        operator_delete((void *)local_2a8._0_8_);
      }
      if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_f8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar6,(_Any_data *)pfVar6,__destroy_functor);
      }
      HVar5 = kError;
      if (HVar3 != kError) {
        HVar4 = HighsSparseMatrix::numNz(local_2b0);
        if (HVar4 < (int)((ulong)((long)(lp->a_matrix_).index_.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(lp->a_matrix_).index_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2)) {
          std::vector<int,_std::allocator<int>_>::resize(&(lp->a_matrix_).index_,(long)HVar4);
        }
        if (HVar4 < (int)((ulong)((long)(lp->a_matrix_).value_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(lp->a_matrix_).value_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 3)) {
          std::vector<double,_std::allocator<double>_>::resize(&(lp->a_matrix_).value_,(long)HVar4);
        }
        HVar5 = kOk;
        if (HVar3 != kOk) {
          highsStatusToString_abi_cxx11_((string *)local_2a8,HVar3);
          highsLogDev(log_options,kInfo,"assessLp returns HighsStatus = %s\n",local_2a8._0_8_);
          HVar5 = HVar3;
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_);
          }
        }
      }
    }
  }
  return HVar5;
}

Assistant:

HighsStatus assessLp(HighsLp& lp, const HighsOptions& options) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status = lpDimensionsOk("assessLp", lp, options.log_options)
                                ? HighsStatus::kOk
                                : HighsStatus::kError;
  return_status = interpretCallStatus(options.log_options, call_status,
                                      return_status, "assessLpDimensions");
  if (return_status == HighsStatus::kError) return return_status;

  if (lp.num_col_) {
    // Assess the LP column costs
    HighsIndexCollection index_collection;
    index_collection.dimension_ = lp.num_col_;
    index_collection.is_interval_ = true;
    index_collection.from_ = 0;
    index_collection.to_ = lp.num_col_ - 1;
    call_status = assessCosts(options, 0, index_collection, lp.col_cost_,
                              lp.has_infinite_cost_, options.infinite_cost);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessCosts");
    if (return_status == HighsStatus::kError) return return_status;
    // Assess the LP column bounds
    call_status = assessBounds(
        options, "Col", 0, index_collection, lp.col_lower_, lp.col_upper_,
        options.infinite_bound, lp.isMip() ? lp.integrality_.data() : nullptr);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessBounds");
    if (return_status == HighsStatus::kError) return return_status;
  }
  if (lp.num_row_) {
    // Assess the LP row bounds
    HighsIndexCollection index_collection;
    index_collection.dimension_ = lp.num_row_;
    index_collection.is_interval_ = true;
    index_collection.from_ = 0;
    index_collection.to_ = lp.num_row_ - 1;
    call_status =
        assessBounds(options, "Row", 0, index_collection, lp.row_lower_,
                     lp.row_upper_, options.infinite_bound);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessBounds");
    if (return_status == HighsStatus::kError) return return_status;
  }
  // If the LP has no columns the matrix must be empty and there is
  // nothing left to test
  if (lp.num_col_ == 0) {
    assert(!lp.a_matrix_.numNz());
    return HighsStatus::kOk;
  }
  // From here, any LP has lp.num_col_ > 0 and lp.a_matrix_.start_[lp.num_col_]
  // exists (as the number of nonzeros)
  assert(lp.num_col_ > 0);

  // Assess the LP matrix - even if there are no rows!
  call_status =
      lp.a_matrix_.assess(options.log_options, "LP", options.small_matrix_value,
                          options.large_matrix_value);
  return_status = interpretCallStatus(options.log_options, call_status,
                                      return_status, "assessMatrix");
  if (return_status == HighsStatus::kError) return return_status;
  // If entries have been removed from the matrix, resize the index
  // and value vectors to prevent bug in presolve
  HighsInt lp_num_nz = lp.a_matrix_.numNz();
  if ((HighsInt)lp.a_matrix_.index_.size() > lp_num_nz)
    lp.a_matrix_.index_.resize(lp_num_nz);
  if ((HighsInt)lp.a_matrix_.value_.size() > lp_num_nz)
    lp.a_matrix_.value_.resize(lp_num_nz);
  if (return_status != HighsStatus::kOk)
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "assessLp returns HighsStatus = %s\n",
                highsStatusToString(return_status).c_str());
  return return_status;
}